

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

void __thiscall
duckdb::BitStringAggOperation::Assign<duckdb::string_t,duckdb::BitAggState<unsigned_long>>
          (BitStringAggOperation *this,BitAggState<unsigned_long> *state,string_t input)

{
  undefined4 uVar1;
  undefined4 *__dest;
  
  if ((uint)state < 0xd) {
    *(BitAggState<unsigned_long> **)(this + 8) = state;
    __dest = input.value._0_8_;
  }
  else {
    __dest = (undefined4 *)operator_new__((ulong)state & 0xffffffff);
    switchD_0193dc74::default(__dest,input.value._0_8_,(ulong)state & 0xffffffff);
    uVar1 = *__dest;
    *(uint *)(this + 8) = (uint)state;
    *(undefined4 *)(this + 0xc) = uVar1;
  }
  *(undefined4 **)(this + 0x10) = __dest;
  return;
}

Assistant:

static void Assign(STATE &state, INPUT_TYPE input) {
		D_ASSERT(state.is_set == false);
		if (input.IsInlined()) {
			state.value = input;
		} else { // non-inlined string, need to allocate space for it
			auto len = input.GetSize();
			auto ptr = new char[len];
			memcpy(ptr, input.GetData(), len);
			state.value = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
		}
	}